

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory_football_factory.cpp
# Opt level: O0

shared_ptr<abstract_factory::ICloth> __thiscall
abstract_factory::FootballAbstractFactory::GetCloth(FootballAbstractFactory *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<abstract_factory::ICloth> sVar1;
  shared_ptr<abstract_factory::FootballCloth> local_28;
  FootballAbstractFactory *this_local;
  
  this_local = this;
  std::make_shared<abstract_factory::FootballCloth>();
  std::shared_ptr<abstract_factory::ICloth>::shared_ptr<abstract_factory::FootballCloth,void>
            ((shared_ptr<abstract_factory::ICloth> *)this,&local_28);
  std::shared_ptr<abstract_factory::FootballCloth>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<abstract_factory::ICloth>)
         sVar1.super___shared_ptr<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ICloth> FootballAbstractFactory::GetCloth() {
    return std::shared_ptr<ICloth>{std::make_shared<FootballCloth>()};
}